

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void soul::SanityCheckPass::checkOverallStructureOfProcessor(ProcessorBase *processorOrGraph)

{
  Function *this;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Processor *pPVar4;
  undefined4 extraout_var;
  Expression *pEVar6;
  long *extraout_RDX;
  Identifier *args;
  int iVar7;
  pool_ptr<soul::AST::Processor> processor;
  anon_class_8_1_532db2b7 hasAnEventEndpoint;
  anon_class_8_1_532db2b7 areAllEndpointsResolved;
  pool_ptr<soul::AST::Processor> local_178;
  ProcessorBase *local_170;
  anon_class_8_1_532db2b7 local_168;
  anon_class_8_1_532db2b7 local_160 [2];
  RefCountedPtr<soul::Structure> local_150;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  long *plVar5;
  
  sVar3 = AST::ModuleBase::getNumOutputs(&processorOrGraph->super_ModuleBase);
  if (sVar3 == 0) {
    Errors::processorNeedsAnOutput<>();
    AST::Context::throwError
              (&(processorOrGraph->super_ModuleBase).super_ASTObject.context,&local_68,false);
  }
  cast<soul::AST::Processor,soul::AST::ProcessorBase>((soul *)&local_178,processorOrGraph);
  if (local_178.object != (Processor *)0x0) {
    local_170 = processorOrGraph;
    pPVar4 = pool_ptr<soul::AST::Processor>::operator->(&local_178);
    iVar2 = (*(pPVar4->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[0x16])
                      (pPVar4);
    iVar7 = 0;
    for (plVar5 = (long *)CONCAT44(extraout_var,iVar2); plVar5 != extraout_RDX; plVar5 = plVar5 + 1)
    {
      bVar1 = AST::Function::isRunFunction((Function *)*plVar5);
      if (bVar1) {
LAB_0023cf87:
        pEVar6 = pool_ptr<soul::AST::Expression>::operator->
                           ((pool_ptr<soul::AST::Expression> *)(*plVar5 + 0x30));
        (*(pEVar6->super_Statement).super_ASTObject._vptr_ASTObject[5])(local_160,pEVar6);
        iVar2 = local_160[0].processorOrGraph._4_4_;
        RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_150);
        this = (Function *)*plVar5;
        if (iVar2 != 1) {
          Errors::functionMustBeVoid<soul::Identifier&>(&local_a0,(Errors *)&this->name,args);
          AST::Context::throwError(&(this->super_ASTObject).context,&local_a0,false);
        }
        if ((this->parameters).
            super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->parameters).
            super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          Errors::functionHasParams<soul::Identifier&>(&local_d8,(Errors *)&this->name,args);
          AST::Context::throwError(&(this->super_ASTObject).context,&local_d8,false);
        }
        bVar1 = AST::Function::isRunFunction(this);
        iVar7 = iVar7 + (uint)bVar1;
      }
      else {
        bVar1 = AST::Function::isUserInitFunction((Function *)*plVar5);
        if (bVar1) goto LAB_0023cf87;
      }
    }
    if (iVar7 == 0) {
      local_160[0].processorOrGraph = local_170;
      local_168.processorOrGraph = local_170;
      bVar1 = checkOverallStructureOfProcessor::anon_class_8_1_532db2b7::operator()(local_160);
      if (bVar1) {
        bVar1 = checkOverallStructureOfProcessor::anon_class_8_1_532db2b7::operator()(&local_168);
        if (!bVar1) {
          pPVar4 = pool_ptr<soul::AST::Processor>::operator->(&local_178);
          Errors::processorNeedsRunFunction<>();
          AST::Context::throwError
                    (&(pPVar4->super_ProcessorBase).super_ModuleBase.super_ASTObject.context,
                     &local_110,false);
        }
      }
    }
    else if (1 < iVar7) {
      pPVar4 = pool_ptr<soul::AST::Processor>::operator->(&local_178);
      Errors::multipleRunFunctions<>();
      AST::Context::throwError
                (&(pPVar4->super_ProcessorBase).super_ModuleBase.super_ASTObject.context,&local_148,
                 false);
    }
  }
  return;
}

Assistant:

static void checkOverallStructureOfProcessor (AST::ProcessorBase& processorOrGraph)
    {
        if (processorOrGraph.getNumOutputs() == 0)
            processorOrGraph.context.throwError (Errors::processorNeedsAnOutput());

        if (auto processor = cast<AST::Processor> (processorOrGraph))
        {
            int numRunFunctions = 0;

            for (auto& f : processor->getFunctions())
            {
                if (f->isRunFunction() || f->isUserInitFunction())
                {
                    if (! f->returnType->resolveAsType().isVoid())
                        f->context.throwError (Errors::functionMustBeVoid (f->name));

                    if (! f->parameters.empty())
                        f->context.throwError (Errors::functionHasParams (f->name));

                    if (f->isRunFunction())
                        ++numRunFunctions;
                }
            }

            // If the processor has non-event I/O then we need a run processor
            if (numRunFunctions == 0)
            {
                auto areAllEndpointsResolved = [&]
                {
                    for (auto e : processorOrGraph.getEndpoints())
                        if (! e->isResolved())
                            return false;

                    return true;
                };

                auto hasAnEventEndpoint = [&]
                {
                    for (auto e : processorOrGraph.getEndpoints())
                        if (isEvent (e->getDetails()))
                            return true;

                    return false;
                };

                if (areAllEndpointsResolved() && ! hasAnEventEndpoint())
                    processor->context.throwError (Errors::processorNeedsRunFunction());
            }

            if (numRunFunctions > 1)
                processor->context.throwError (Errors::multipleRunFunctions());
        }
    }